

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Builder * __thiscall
capnp::LocalCallContext::getResults
          (Builder *__return_storage_ptr__,LocalCallContext *this,
          Maybe<capnp::MessageSize> *sizeHint)

{
  Reader reader;
  bool bVar1;
  LocalResponse *pLVar2;
  Own<capnp::LocalResponse,_std::nullptr_t> *other;
  Own<capnp::ResponseHook,_std::nullptr_t> local_b8;
  Reader local_a8;
  Response<capnp::AnyPointer> local_88;
  Builder local_48;
  undefined1 local_30 [8];
  Own<capnp::LocalResponse,_std::nullptr_t> localResponse;
  Maybe<capnp::MessageSize> *sizeHint_local;
  LocalCallContext *this_local;
  
  bVar1 = kj::Maybe<capnp::Response<capnp::AnyPointer>_>::operator==(&this->response);
  if (bVar1) {
    kj::heap<capnp::LocalResponse,kj::Maybe<capnp::MessageSize>&>((kj *)local_30,sizeHint);
    pLVar2 = kj::Own<capnp::LocalResponse,_std::nullptr_t>::operator->
                       ((Own<capnp::LocalResponse,_std::nullptr_t> *)local_30);
    MessageBuilder::getRoot<capnp::AnyPointer>(&local_48,&(pLVar2->message).super_MessageBuilder);
    (this->responseBuilder).builder.pointer = local_48.builder.pointer;
    (this->responseBuilder).builder.segment = local_48.builder.segment;
    (this->responseBuilder).builder.capTable = local_48.builder.capTable;
    AnyPointer::Builder::asReader(&local_a8,&this->responseBuilder);
    other = kj::mv<kj::Own<capnp::LocalResponse,decltype(nullptr)>>
                      ((Own<capnp::LocalResponse,_std::nullptr_t> *)local_30);
    kj::Own<capnp::ResponseHook,decltype(nullptr)>::Own<capnp::LocalResponse,void>
              ((Own<capnp::ResponseHook,decltype(nullptr)> *)&local_b8,other);
    reader.reader.capTable = local_a8.reader.capTable;
    reader.reader.segment = local_a8.reader.segment;
    reader.reader.pointer = local_a8.reader.pointer;
    reader.reader.nestingLimit = local_a8.reader.nestingLimit;
    reader.reader._28_4_ = local_a8.reader._28_4_;
    Response<capnp::AnyPointer>::Response(&local_88,reader,&local_b8);
    kj::Maybe<capnp::Response<capnp::AnyPointer>_>::operator=(&this->response,&local_88);
    Response<capnp::AnyPointer>::~Response(&local_88);
    kj::Own<capnp::ResponseHook,_std::nullptr_t>::~Own(&local_b8);
    kj::Own<capnp::LocalResponse,_std::nullptr_t>::~Own
              ((Own<capnp::LocalResponse,_std::nullptr_t> *)local_30);
  }
  (__return_storage_ptr__->builder).segment = (this->responseBuilder).builder.segment;
  (__return_storage_ptr__->builder).capTable = (this->responseBuilder).builder.capTable;
  (__return_storage_ptr__->builder).pointer = (this->responseBuilder).builder.pointer;
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Builder getResults(kj::Maybe<MessageSize> sizeHint) override {
    if (response == kj::none) {
      auto localResponse = kj::heap<LocalResponse>(sizeHint);
      responseBuilder = localResponse->message.getRoot<AnyPointer>();
      response = Response<AnyPointer>(responseBuilder.asReader(), kj::mv(localResponse));
    }
    return responseBuilder;
  }